

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGui::BeginDocked(ImGui *this,ImGuiWindow *window,bool *p_open)

{
  ImGui IVar1;
  uint uVar2;
  ImGuiDockContext *this_00;
  ImGuiContext *ctx;
  ImGuiContext *pIVar3;
  uint uVar4;
  int iVar5;
  ImGuiContext *g_2;
  void *pvVar6;
  ImGuiDockNode *node;
  char cVar7;
  undefined1 extraout_DL;
  undefined1 clear_persistent_docking_ref;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  ImGuiID IVar8;
  ImGuiDockNode *pIVar9;
  ImGuiDockNode *node_00;
  ImGuiContext *g;
  
  ctx = GImGui;
  clear_persistent_docking_ref = SUB81(p_open,0);
  if (((GImGui->IO).ConfigDockingAlwaysTabBar == false) && (this[0x24] == (ImGui)0x0)) {
    uVar4 = *(uint *)(this + 0xc);
LAB_0015dbc0:
    cVar7 = '\0';
    if ((((GImGui->NextWindowData).Flags & 1) != 0) &&
       (uVar2 = (GImGui->NextWindowData).PosCond, clear_persistent_docking_ref = (undefined1)uVar2,
       (*(uint *)(this + 0xd4) & uVar2) != 0)) {
      cVar7 = (GImGui->NextWindowData).PosUndock;
    }
    if (cVar7 != '\0' || (uVar4 >> 0x15 & 1) != 0) goto LAB_0015dbed;
    IVar8 = *(ImGuiID *)(this + 0x420);
  }
  else {
    uVar4 = *(uint *)(this + 0xc);
    if (((uVar4 & 0x1200001) != 0) || (this[0xb7] != (ImGui)0x0)) goto LAB_0015dbc0;
    IVar8 = *(ImGuiID *)(this + 0x420);
    if (IVar8 == 0) {
      this_00 = GImGui->DockContext;
      IVar8 = 0;
      do {
        IVar8 = IVar8 + 1;
        pvVar6 = ImGuiStorage::GetVoidPtr(&this_00->Nodes,IVar8);
      } while (pvVar6 != (void *)0x0);
      *(ImGuiID *)(this + 0x420) = IVar8;
      clear_persistent_docking_ref = extraout_DL;
    }
  }
  node = *(ImGuiDockNode **)(this + 0x410);
  if (node == (ImGuiDockNode *)0x0 && IVar8 != 0) {
    node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&ctx->DockContext->Nodes,IVar8);
    if (node == (ImGuiDockNode *)0x0) {
      node = DockContextAddNode(ctx,IVar8);
      uVar4 = *(uint *)&node->field_0xb0 & 0xfffffe00 | 0x92;
      *(short *)&node->field_0xb0 = (short)uVar4;
      node->LastFrameAlive = ctx->FrameCount;
    }
    else {
      clear_persistent_docking_ref = extraout_DL_00;
      if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) goto LAB_0015dbed;
      uVar4 = (uint)*(ushort *)&node->field_0xb0;
    }
    pIVar9 = node;
    if ((uVar4 >> 9 & 1) == 0) {
      do {
        *(ushort *)&pIVar9->field_0xb0 = (ushort)uVar4 | 0x200;
        pIVar9->field_0xb2 = pIVar9->field_0xb2 | 8;
        node_00 = pIVar9->ParentNode;
        if (pIVar9->ParentNode == (ImGuiDockNode *)0x0) {
          node_00 = pIVar9;
        }
        uVar4 = *(uint *)&node_00->field_0xb0;
        pIVar9 = node_00;
      } while ((uVar4 >> 9 & 1) == 0);
      DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,true);
      DockNodeAddWindow(node,(ImGuiWindow *)this,true);
      clear_persistent_docking_ref = extraout_DL_01;
      if (node == (ImGuiDockNode *)0x0) {
        return;
      }
    }
    else {
      DockNodeAddWindow(node,(ImGuiWindow *)this,true);
      clear_persistent_docking_ref = extraout_DL_02;
    }
  }
  if (node->LastFrameAlive < ctx->FrameCount) {
    do {
      pIVar9 = node;
      node = pIVar9->ParentNode;
    } while (node != (ImGuiDockNode *)0x0);
    if (ctx->FrameCount <= pIVar9->LastFrameAlive) {
      this[0x43a] = (ImGui)(((byte)this[0x43a] & 0xfc) + 1);
      return;
    }
LAB_0015dbed:
    DockContextProcessUndockWindow
              ((ImGuiContext *)this,(ImGuiWindow *)0x1,(bool)clear_persistent_docking_ref);
    return;
  }
  if (node->HostWindow == (ImGuiWindow *)0x0) {
    this[0x43a] = (ImGui)((byte)this[0x43a] & 0xfc |
                         node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing
                         );
    return;
  }
  node->State = ImGuiDockNodeState_HostWindowVisible;
  pIVar3 = GImGui;
  if (*(short *)(this + 0xbe) < node->HostWindow->BeginOrderWithinContext) goto LAB_0015dbed;
  uVar4 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar4 | 1;
  (pIVar3->NextWindowData).PosVal = node->Pos;
  (pIVar3->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar3->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar3->NextWindowData).PosCond = 1;
  (pIVar3->NextWindowData).PosUndock = true;
  (pIVar3->NextWindowData).Flags = uVar4 | 3;
  (pIVar3->NextWindowData).SizeVal = node->Size;
  (pIVar3->NextWindowData).SizeCond = 1;
  (ctx->NextWindowData).PosUndock = false;
  IVar1 = this[0x43a];
  this[0x43a] = (ImGui)(((byte)IVar1 & 0xfc) + 1);
  if ((node->SharedFlags & 1) != 0) {
    return;
  }
  if (node->VisibleWindow == (ImGuiWindow *)this) {
    this[0x43a] = (ImGui)((byte)IVar1 | 3);
  }
  uVar4 = *(uint *)(this + 0xc) | 0x1010003;
  if ((node->LocalFlags & 0x3000U) == 0) {
    uVar4 = *(uint *)(this + 0xc) & 0xfefefffc | 0x1010002;
  }
  *(uint *)(this + 0xc) = uVar4;
  if ((node->TabBar != (ImGuiTabBar *)0x0) && (node->TabBar->CurrFrameVisible != -1)) {
    iVar5 = DockNodeGetTabOrder((ImGuiWindow *)this);
    *(short *)(this + 0x438) = (short)iVar5;
  }
  if ((node->field_0xb1 & 0x40) == 0) {
    if ((window == (ImGuiWindow *)0x0) || (node->WantCloseTabID != *(ImGuiID *)(this + 8)))
    goto LAB_0015de7b;
  }
  else if (window == (ImGuiWindow *)0x0) goto LAB_0015de7b;
  *(undefined1 *)&window->Name = 0;
LAB_0015de7b:
  IVar8 = ImGuiWindow::GetID(*(ImGuiWindow **)(*(long *)(this + 0x410) + 0x78),*(char **)this,
                             (char *)0x0);
  *(ImGuiID *)(this + 0x80) = IVar8;
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
        {
            DockContextProcessUndockWindow(ctx, window);
        }
        else
        {
            window->DockIsActive = true;
            window->DockTabIsVisible = false;
        }
        return;
    }

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        window->DockIsActive = (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing);
        window->DockTabIsVisible = false;
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockTabIsVisible = false;
    if (node->SharedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the tab bar has been visible once.
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && node->TabBar->CurrFrameVisible != -1)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabID == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}